

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rangeproof_impl.h
# Opt level: O1

int secp256k1_rangeproof_verify_impl
              (secp256k1_ecmult_context *ecmult_ctx,secp256k1_ecmult_gen_context *ecmult_gen_ctx,
              uchar *blindout,uint64_t *value_out,uchar *message_out,size_t *outlen,uchar *nonce,
              uint64_t *min_value,uint64_t *max_value,secp256k1_ge *commit,uchar *proof,size_t plen,
              uchar *extra_commit,size_t extra_commit_len,secp256k1_ge *genp)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  uint in_EAX;
  int iVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  size_t rings;
  secp256k1_scalar *psVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  size_t sVar13;
  ulong uVar14;
  long unaff_R15;
  uint64_t value;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  uint local_6354;
  long local_6328;
  int overflow;
  ulong local_6318;
  uint64_t vv;
  uchar *local_6308;
  uint64_t *local_6300;
  uchar m [33];
  secp256k1_gej accj;
  uchar signs [31];
  secp256k1_scalar blind;
  secp256k1_ge c;
  secp256k1_sha256 local_61a8;
  size_t rsizes [32];
  secp256k1_scalar s [128];
  secp256k1_gej pubs [128];
  secp256k1_scalar evalues [128];
  
  bVar3 = true;
  if (0x40 < plen) {
    bVar1 = *proof;
    in_EAX = 0;
    if (-1 < (char)bVar1) {
      unaff_R15 = 1;
      if (bVar1 < 0x40) {
        local_6354 = 0xffffffff;
        local_6318 = 1;
        uVar12 = 0;
      }
      else {
        local_6354 = bVar1 & 0x1f;
        local_6318 = 1;
        if (0x12 < (byte)local_6354) {
          in_EAX = 0;
          goto LAB_0010e1d6;
        }
        bVar2 = proof[1];
        in_EAX = bVar2 + 1;
        if (0x3f < bVar2) goto LAB_0010e1d6;
        uVar12 = 0xffffffffffffffff >> (~bVar2 & 0x3f);
        local_6318 = 2;
      }
      *max_value = uVar12;
      if (0 < (int)local_6354) {
        uVar12 = *max_value;
        uVar8 = local_6354;
        do {
          if (0x1999999999999999 < uVar12) goto LAB_0010e1d6;
          uVar12 = uVar12 * 10;
          *max_value = uVar12;
          unaff_R15 = unaff_R15 * 10;
          uVar8 = uVar8 - 1;
        } while (uVar8 != 0);
      }
      *min_value = 0;
      if ((bVar1 & 0x20) != 0) {
        if (plen - local_6318 < 8) goto LAB_0010e1d6;
        uVar12 = *min_value;
        lVar10 = 0;
        do {
          uVar12 = uVar12 << 8 | (ulong)proof[lVar10 + local_6318];
          *min_value = uVar12;
          lVar10 = lVar10 + 1;
        } while (lVar10 != 8);
        local_6318 = local_6318 | 8;
      }
      bVar3 = true;
      if (!CARRY8(*max_value,*min_value)) {
        *max_value = *max_value + *min_value;
        bVar3 = false;
      }
      goto LAB_0010e1d6;
    }
  }
  local_6318 = 0;
  bVar3 = true;
LAB_0010e1d6:
  if (!bVar3) {
    rsizes[0] = 1;
    if (in_EAX == 0) {
      rings = 1;
      uVar12 = 1;
    }
    else {
      rings = (size_t)((int)in_EAX >> 1);
      if (in_EAX != 1) {
        lVar10 = rings + (rings == 0);
        lVar11 = lVar10 + -1;
        auVar15._8_4_ = (int)lVar11;
        auVar15._0_8_ = lVar11;
        auVar15._12_4_ = (int)((ulong)lVar11 >> 0x20);
        uVar12 = 0;
        auVar15 = auVar15 ^ _DAT_00120090;
        auVar16 = _DAT_00120080;
        do {
          auVar17 = auVar16 ^ _DAT_00120090;
          if ((bool)(~(auVar17._4_4_ == auVar15._4_4_ && auVar15._0_4_ < auVar17._0_4_ ||
                      auVar15._4_4_ < auVar17._4_4_) & 1)) {
            rsizes[uVar12] = 4;
          }
          if ((auVar17._12_4_ != auVar15._12_4_ || auVar17._8_4_ <= auVar15._8_4_) &&
              auVar17._12_4_ <= auVar15._12_4_) {
            rsizes[uVar12 + 1] = 4;
          }
          uVar12 = uVar12 + 2;
          lVar11 = auVar16._8_8_;
          auVar16._0_8_ = auVar16._0_8_ + 2;
          auVar16._8_8_ = lVar11 + 2;
        } while ((lVar10 + 1U & 0xfffffffffffffffe) != uVar12);
      }
      uVar12 = (ulong)(int)(in_EAX * 2 & 0xfffffffc);
      if ((in_EAX & 1) != 0) {
        rsizes[rings] = 2;
        uVar12 = uVar12 | 2;
        rings = rings + 1;
      }
    }
    uVar7 = rings + 6 >> 3;
    if ((uVar12 + rings) * 0x20 + uVar7 <= plen - local_6318) {
      local_61a8.s[0] = 0x6a09e667;
      local_61a8.s[1] = 0xbb67ae85;
      local_61a8.s[2] = 0x3c6ef372;
      local_61a8.s[3] = 0xa54ff53a;
      local_61a8.s[4] = 0x510e527f;
      local_61a8.s[5] = 0x9b05688c;
      local_61a8.s[6] = 0x1f83d9ab;
      local_61a8.s[7] = 0x5be0cd19;
      local_61a8.bytes = 0;
      s[1].d[0] = (commit->x).n[4];
      s[0].d[0] = (commit->x).n[0];
      s[0].d[1] = (commit->x).n[1];
      s[0].d[2] = (commit->x).n[2];
      s[0].d[3] = (commit->x).n[3];
      local_6308 = message_out;
      local_6300 = value_out;
      secp256k1_fe_normalize((secp256k1_fe *)s);
      iVar4 = secp256k1_fe_sqrt(&pubs[0].x,&commit->y);
      m[0] = (byte)iVar4 ^ 1;
      secp256k1_fe_get_b32(m + 1,(secp256k1_fe *)s);
      secp256k1_sha256_write(&local_61a8,m,0x21);
      s[1].d[0] = (genp->x).n[4];
      s[0].d[0] = (genp->x).n[0];
      s[0].d[1] = (genp->x).n[1];
      s[0].d[2] = (genp->x).n[2];
      s[0].d[3] = (genp->x).n[3];
      secp256k1_fe_normalize((secp256k1_fe *)s);
      iVar4 = secp256k1_fe_sqrt(&pubs[0].x,&genp->y);
      m[0] = (byte)iVar4 ^ 1;
      secp256k1_fe_get_b32(m + 1,(secp256k1_fe *)s);
      uVar12 = local_6318;
      secp256k1_sha256_write(&local_61a8,m,0x21);
      secp256k1_sha256_write(&local_61a8,proof,uVar12);
      uVar14 = rings - 1;
      if (uVar14 != 0) {
        uVar6 = 0;
        do {
          signs[uVar6] = (proof[(uVar6 >> 3) + uVar12] >> ((uint)uVar6 & 7) & 1) != 0;
          uVar6 = uVar6 + 1;
        } while (uVar14 != uVar6);
      }
      lVar10 = uVar7 + uVar12;
      if (((uVar14 & 7) == 0) || (proof[lVar10 + -1] >> (sbyte)(uVar14 & 7) == 0)) {
        accj.infinity = 1;
        accj.x.n[0] = 0;
        accj.x.n[1] = 0;
        accj.x.n[2] = 0;
        accj.x.n[3] = 0;
        accj.x.n[4] = 0;
        accj.y.n[0] = 0;
        accj.y.n[1] = 0;
        accj.y.n[2] = 0;
        accj.y.n[3] = 0;
        accj.y.n[4] = 0;
        accj.z.n[0] = 0;
        accj.z.n[1] = 0;
        accj.z.n[2] = 0;
        accj.z.n[3] = 0;
        accj.z.n[4] = 0;
        if (*min_value != 0) {
          pubs[0].x.n[1] = 0;
          pubs[0].x.n[2] = 0;
          pubs[0].x.n[3] = 0;
          pubs[0].x.n[0] = *min_value;
          secp256k1_ecmult_const(&accj,genp,(secp256k1_scalar *)pubs,0x40);
        }
        if (uVar14 == 0) {
          local_6328 = 0;
        }
        else {
          uVar12 = 0;
          local_6328 = 0;
          do {
            iVar4 = secp256k1_fe_set_b32((secp256k1_fe *)s,proof + lVar10);
            if ((iVar4 == 0) || (iVar4 = secp256k1_ge_set_xquad(&c,(secp256k1_fe *)s), iVar4 == 0))
            {
              bVar3 = false;
            }
            else {
              if (signs[uVar12] != '\0') {
                secp256k1_ge_neg(&c,&c);
              }
              secp256k1_sha256_write(&local_61a8,signs + uVar12,1);
              secp256k1_sha256_write(&local_61a8,proof + lVar10,0x20);
              pubs[local_6328].infinity = c.infinity;
              pubs[local_6328].x.n[0] = c.x.n[0];
              pubs[local_6328].x.n[1] = c.x.n[1];
              pubs[local_6328].x.n[2] = c.x.n[2];
              pubs[local_6328].x.n[3] = c.x.n[3];
              pubs[local_6328].x.n[4] = c.x.n[4];
              pubs[local_6328].y.n[0] = c.y.n[0];
              pubs[local_6328].y.n[1] = c.y.n[1];
              pubs[local_6328].y.n[2] = c.y.n[2];
              pubs[local_6328].y.n[3] = c.y.n[3];
              pubs[local_6328].y.n[4] = c.y.n[4];
              pubs[local_6328].z.n[0] = 1;
              pubs[local_6328].z.n[3] = 0;
              pubs[local_6328].z.n[4] = 0;
              pubs[local_6328].z.n[1] = 0;
              pubs[local_6328].z.n[2] = 0;
              secp256k1_gej_add_ge_var(&accj,&accj,&c,(secp256k1_fe *)0x0);
              lVar10 = lVar10 + 0x20;
              local_6328 = local_6328 + rsizes[uVar12];
              bVar3 = true;
            }
            if (!bVar3) {
              return 0;
            }
            uVar12 = uVar12 + 1;
          } while (uVar14 != uVar12);
        }
        secp256k1_gej_neg(&accj,&accj);
        secp256k1_gej_add_ge_var(pubs + local_6328,&accj,commit,(secp256k1_fe *)0x0);
        if (pubs[local_6328].infinity == 0) {
          secp256k1_rangeproof_pub_expand(pubs,local_6354,rsizes,rings,genp);
          sVar13 = lVar10 + 0x20;
          local_6328 = local_6328 + rsizes[rings - 1];
          if (local_6328 != 0) {
            psVar9 = s;
            do {
              secp256k1_scalar_set_b32(psVar9,proof + sVar13,&overflow);
              if (overflow != 0) {
                return 0;
              }
              sVar13 = sVar13 + 0x20;
              psVar9 = psVar9 + 1;
              local_6328 = local_6328 + -1;
            } while (local_6328 != 0);
          }
          if (sVar13 == plen) {
            if (extra_commit != (uchar *)0x0) {
              secp256k1_sha256_write(&local_61a8,extra_commit,extra_commit_len);
            }
            secp256k1_sha256_finalize(&local_61a8,m);
            psVar9 = evalues;
            if (nonce == (uchar *)0x0) {
              psVar9 = (secp256k1_scalar *)0x0;
            }
            iVar4 = secp256k1_borromean_verify
                              (ecmult_ctx,psVar9,proof + lVar10,s,pubs,rsizes,rings,m,0x20);
            if (nonce == (uchar *)0x0) {
              return iVar4;
            }
            if (iVar4 == 0) {
              return 0;
            }
            if ((ecmult_gen_ctx != (secp256k1_ecmult_gen_context *)0x0) &&
               (iVar5 = secp256k1_rangeproof_rewind_inner
                                  (&blind,&vv,local_6308,outlen,evalues,s,rsizes,rings,nonce,commit,
                                   proof,local_6318,genp), iVar5 != 0)) {
              value = unaff_R15 * vv + *min_value;
              vv = value;
              secp256k1_pedersen_ecmult(&accj,&blind,value,genp,&secp256k1_ge_const_g);
              if (accj.infinity == 0) {
                secp256k1_gej_neg(&accj,&accj);
                secp256k1_gej_add_ge_var(&accj,&accj,commit,(secp256k1_fe *)0x0);
                if (accj.infinity != 0) {
                  if (blindout != (uchar *)0x0) {
                    secp256k1_scalar_get_b32(blindout,&blind);
                  }
                  if (local_6300 == (uint64_t *)0x0) {
                    return iVar4;
                  }
                  *local_6300 = value;
                  return iVar4;
                }
              }
            }
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

SECP256K1_INLINE static int secp256k1_rangeproof_verify_impl(const secp256k1_ecmult_context* ecmult_ctx,
 const secp256k1_ecmult_gen_context* ecmult_gen_ctx,
 unsigned char *blindout, uint64_t *value_out, unsigned char *message_out, size_t *outlen, const unsigned char *nonce,
 uint64_t *min_value, uint64_t *max_value, const secp256k1_ge *commit, const unsigned char *proof, size_t plen, const unsigned char *extra_commit, size_t extra_commit_len, const secp256k1_ge* genp) {
    secp256k1_gej accj;
    secp256k1_gej pubs[128];
    secp256k1_ge c;
    secp256k1_scalar s[128];
    secp256k1_scalar evalues[128]; /* Challenges, only used during proof rewind. */
    secp256k1_sha256 sha256_m;
    size_t rsizes[32];
    int ret;
    size_t i;
    int exp;
    int mantissa;
    size_t offset;
    size_t rings;
    int overflow;
    size_t npub;
    int offset_post_header;
    uint64_t scale;
    unsigned char signs[31];
    unsigned char m[33];
    const unsigned char *e0;
    offset = 0;
    if (!secp256k1_rangeproof_getheader_impl(&offset, &exp, &mantissa, &scale, min_value, max_value, proof, plen)) {
        return 0;
    }
    offset_post_header = offset;
    rings = 1;
    rsizes[0] = 1;
    npub = 1;
    if (mantissa != 0) {
        rings = (mantissa >> 1);
        for (i = 0; i < rings; i++) {
            rsizes[i] = 4;
        }
        npub = (mantissa >> 1) << 2;
        if (mantissa & 1) {
            rsizes[rings] = 2;
            npub += rsizes[rings];
            rings++;
        }
    }
    VERIFY_CHECK(rings <= 32);
    if (plen - offset < 32 * (npub + rings - 1) + 32 + ((rings+6) >> 3)) {
        return 0;
    }
    secp256k1_sha256_initialize(&sha256_m);
    secp256k1_rangeproof_serialize_point(m, commit);
    secp256k1_sha256_write(&sha256_m, m, 33);
    secp256k1_rangeproof_serialize_point(m, genp);
    secp256k1_sha256_write(&sha256_m, m, 33);
    secp256k1_sha256_write(&sha256_m, proof, offset);
    for(i = 0; i < rings - 1; i++) {
        signs[i] = (proof[offset + ( i>> 3)] & (1 << (i & 7))) != 0;
    }
    offset += (rings + 6) >> 3;
    if ((rings - 1) & 7) {
        /* Number of coded blinded points is not a multiple of 8, force extra sign bits to 0 to reject mutation. */
        if ((proof[offset - 1] >> ((rings - 1) & 7)) != 0) {
            return 0;
        }
    }
    npub = 0;
    secp256k1_gej_set_infinity(&accj);
    if (*min_value) {
        secp256k1_scalar mvs;
        secp256k1_scalar_set_u64(&mvs, *min_value);
        secp256k1_ecmult_const(&accj, genp, &mvs, 64);
        secp256k1_scalar_clear(&mvs);
    }
    for(i = 0; i < rings - 1; i++) {
        secp256k1_fe fe;
        if (!secp256k1_fe_set_b32(&fe, &proof[offset]) ||
            !secp256k1_ge_set_xquad(&c, &fe)) {
            return 0;
        }
        if (signs[i]) {
            secp256k1_ge_neg(&c, &c);
        }
        /* Not using secp256k1_rangeproof_serialize_point as we almost have it
         * serialized form already. */
        secp256k1_sha256_write(&sha256_m, &signs[i], 1);
        secp256k1_sha256_write(&sha256_m, &proof[offset], 32);
        secp256k1_gej_set_ge(&pubs[npub], &c);
        secp256k1_gej_add_ge_var(&accj, &accj, &c, NULL);
        offset += 32;
        npub += rsizes[i];
    }
    secp256k1_gej_neg(&accj, &accj);
    secp256k1_gej_add_ge_var(&pubs[npub], &accj, commit, NULL);
    if (secp256k1_gej_is_infinity(&pubs[npub])) {
        return 0;
    }
    secp256k1_rangeproof_pub_expand(pubs, exp, rsizes, rings, genp);
    npub += rsizes[rings - 1];
    e0 = &proof[offset];
    offset += 32;
    for (i = 0; i < npub; i++) {
        secp256k1_scalar_set_b32(&s[i], &proof[offset], &overflow);
        if (overflow) {
            return 0;
        }
        offset += 32;
    }
    if (offset != plen) {
        /*Extra data found, reject.*/
        return 0;
    }
    if (extra_commit != NULL) {
        secp256k1_sha256_write(&sha256_m, extra_commit, extra_commit_len);
    }
    secp256k1_sha256_finalize(&sha256_m, m);
    ret = secp256k1_borromean_verify(ecmult_ctx, nonce ? evalues : NULL, e0, s, pubs, rsizes, rings, m, 32);
    if (ret && nonce) {
        /* Given the nonce, try rewinding the witness to recover its initial state. */
        secp256k1_scalar blind;
        uint64_t vv;
        if (!ecmult_gen_ctx) {
            return 0;
        }
        if (!secp256k1_rangeproof_rewind_inner(&blind, &vv, message_out, outlen, evalues, s, rsizes, rings, nonce, commit, proof, offset_post_header, genp)) {
            return 0;
        }
        /* Unwind apparently successful, see if the commitment can be reconstructed. */
        /* FIXME: should check vv is in the mantissa's range. */
        vv = (vv * scale) + *min_value;
        secp256k1_pedersen_ecmult(&accj, &blind, vv, genp, &secp256k1_ge_const_g);
        if (secp256k1_gej_is_infinity(&accj)) {
            return 0;
        }
        secp256k1_gej_neg(&accj, &accj);
        secp256k1_gej_add_ge_var(&accj, &accj, commit, NULL);
        if (!secp256k1_gej_is_infinity(&accj)) {
            return 0;
        }
        if (blindout) {
            secp256k1_scalar_get_b32(blindout, &blind);
        }
        if (value_out) {
            *value_out = vv;
        }
    }
    return ret;
}